

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints(MeshEdgebreakerEncoder *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  Type TVar6;
  pointer pMVar7;
  undefined4 extraout_var;
  PointAttribute *this_00;
  undefined4 extraout_var_00;
  ulong uVar8;
  size_type sVar9;
  MeshEncoder *in_RDI;
  int i_1;
  bool seam_found;
  PointIndex point_index;
  size_t num_attribute_seams;
  CornerIndex corner_index;
  CornerIndex last_corner_index;
  PointIndex last_point_index;
  PointIndex first_point_index;
  CornerIndex first_corner_index;
  VertexIndex vi;
  MeshAttributeCornerTable *att_corner_table;
  int i;
  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
  attribute_corner_tables;
  size_t num_points;
  CornerTable *corner_table;
  undefined4 in_stack_fffffffffffffea8;
  int32_t in_stack_fffffffffffffeac;
  CornerIndex in_stack_fffffffffffffeb0;
  VertexIndex in_stack_fffffffffffffeb4;
  CornerIndex in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  VertexIndex in_stack_fffffffffffffec0;
  VertexIndex in_stack_fffffffffffffec4;
  ThisIndexType local_ac;
  uint local_a8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_a4;
  uint local_a0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_9c;
  int local_98;
  byte local_91;
  uint local_90;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_8c;
  long local_88;
  uint local_7c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_78;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_74;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_60;
  uint local_5c;
  uint local_58;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_54;
  long local_50;
  int local_34;
  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
  local_30;
  size_t local_18;
  CornerTable *local_10;
  
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                      *)0x19164b);
  if (bVar2) {
    pMVar7 = std::
             unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             ::operator->((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                           *)0x191668);
    iVar3 = (*pMVar7->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    local_10 = (CornerTable *)CONCAT44(extraout_var,iVar3);
    if (local_10 != (CornerTable *)0x0) {
      iVar3 = CornerTable::num_vertices((CornerTable *)0x191696);
      iVar4 = CornerTable::NumIsolatedVertices(local_10);
      local_18 = (size_t)(iVar3 - iVar4);
      MeshEncoder::mesh(in_RDI);
      iVar5 = PointCloud::num_attributes((PointCloud *)0x1916d4);
      if (1 < iVar5) {
        std::
        vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ::vector((vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                  *)0x1916ea);
        local_34 = 0;
        while( true ) {
          iVar3 = local_34;
          MeshEncoder::mesh(in_RDI);
          iVar5 = PointCloud::num_attributes((PointCloud *)0x191727);
          if (iVar5 <= iVar3) break;
          MeshEncoder::mesh(in_RDI);
          this_00 = PointCloud::attribute
                              ((PointCloud *)
                               CONCAT44(in_stack_fffffffffffffeb4.value_,
                                        in_stack_fffffffffffffeb0.value_),in_stack_fffffffffffffeac)
          ;
          TVar6 = GeometryAttribute::attribute_type(&this_00->super_GeometryAttribute);
          if (TVar6 != POSITION) {
            iVar3 = (*(in_RDI->super_PointCloudEncoder)._vptr_PointCloudEncoder[0xe])();
            local_50 = CONCAT44(extraout_var_00,iVar3);
            if (local_50 != 0) {
              std::
              vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
              ::push_back((vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                           *)CONCAT44(in_stack_fffffffffffffec4.value_,
                                      in_stack_fffffffffffffec0.value_),
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffffebf,
                                   CONCAT16(in_stack_fffffffffffffebe,
                                            CONCAT24(in_stack_fffffffffffffebc,
                                                     in_stack_fffffffffffffeb8.value_))));
            }
          }
          local_34 = local_34 + 1;
        }
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_54,0);
        while( true ) {
          local_58 = CornerTable::num_vertices((CornerTable *)0x19183b);
          bVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator<
                            (&local_54,&local_58);
          if (!bVar2) break;
          local_5c = local_54.value_;
          bVar2 = CornerTable::IsVertexIsolated
                            ((CornerTable *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             in_stack_fffffffffffffeb4);
          if (!bVar2) {
            local_64 = local_54.value_;
            local_60.value_ =
                 (uint)CornerTable::LeftMostCorner
                                 ((CornerTable *)
                                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                  in_stack_fffffffffffffeb0.value_);
            MeshEncoder::mesh(in_RDI);
            local_6c = local_60.value_;
            local_70.value_ =
                 (uint)Mesh::CornerToPointId
                                 ((Mesh *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                  in_stack_fffffffffffffeb0);
            local_74.value_ = local_60.value_;
            local_7c = local_60.value_;
            local_68 = local_70.value_;
            local_78.value_ =
                 (uint)CornerTable::SwingRight
                                 ((CornerTable *)
                                  CONCAT17(in_stack_fffffffffffffebf,
                                           CONCAT16(in_stack_fffffffffffffebe,
                                                    CONCAT24(in_stack_fffffffffffffebc,
                                                             in_stack_fffffffffffffeb8.value_))),
                                  in_stack_fffffffffffffec0.value_);
            local_88 = 0;
            while (bVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                     (&local_78,
                                      (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                      &kInvalidCornerIndex), bVar2) {
              MeshEncoder::mesh(in_RDI);
              local_90 = local_78.value_;
              local_8c.value_ =
                   (uint)Mesh::CornerToPointId
                                   ((Mesh *)CONCAT44(in_stack_fffffffffffffeac,
                                                     in_stack_fffffffffffffea8),
                                    in_stack_fffffffffffffeb0);
              local_91 = 0;
              bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator!=
                                (&local_8c,&local_70);
              if (bVar2) {
                local_91 = 1;
                IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(&local_70,&local_8c)
                ;
              }
              else {
                for (local_98 = 0; uVar8 = (ulong)local_98,
                    sVar9 = std::
                            vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                            ::size(&local_30), uVar8 < sVar9; local_98 = local_98 + 1) {
                  std::
                  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                  ::operator[](&local_30,(long)local_98);
                  local_a0 = local_78.value_;
                  in_stack_fffffffffffffec4 =
                       MeshAttributeCornerTable::Vertex
                                 ((MeshAttributeCornerTable *)
                                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                  in_stack_fffffffffffffeb0);
                  local_9c.value_ = in_stack_fffffffffffffec4.value_;
                  std::
                  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                  ::operator[](&local_30,(long)local_98);
                  local_a8 = local_74.value_;
                  in_stack_fffffffffffffec0 =
                       MeshAttributeCornerTable::Vertex
                                 ((MeshAttributeCornerTable *)
                                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                  in_stack_fffffffffffffeb0);
                  local_a4.value_ = in_stack_fffffffffffffec0.value_;
                  in_stack_fffffffffffffebf =
                       IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator!=
                                 (&local_9c,&local_a4);
                  if ((bool)in_stack_fffffffffffffebf) {
                    local_91 = 1;
                    break;
                  }
                }
              }
              if ((local_91 & 1) != 0) {
                local_88 = local_88 + 1;
              }
              in_stack_fffffffffffffebe =
                   IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                             (&local_78,&local_60);
              if ((bool)in_stack_fffffffffffffebe) break;
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_74,&local_78);
              in_stack_fffffffffffffeb8 =
                   CornerTable::SwingRight
                             ((CornerTable *)
                              CONCAT17(in_stack_fffffffffffffebf,
                                       CONCAT16(in_stack_fffffffffffffebe,
                                                CONCAT24(in_stack_fffffffffffffebc,
                                                         in_stack_fffffffffffffeb8.value_))),
                              in_stack_fffffffffffffec0.value_);
              local_ac.value_ = in_stack_fffffffffffffeb8.value_;
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_78,&local_ac);
            }
            bVar2 = CornerTable::IsOnBoundary
                              ((CornerTable *)
                               CONCAT17(in_stack_fffffffffffffebf,
                                        CONCAT16(in_stack_fffffffffffffebe,
                                                 CONCAT24(in_stack_fffffffffffffebc,
                                                          in_stack_fffffffffffffeb8.value_))),
                               in_stack_fffffffffffffec0);
            in_stack_fffffffffffffeb4.value_ =
                 CONCAT13(bVar2,(int3)in_stack_fffffffffffffeb4.value_);
            lVar1 = local_88;
            if ((!bVar2) && (local_88 != 0)) {
              lVar1 = local_88 + -1;
            }
            local_18 = lVar1 + local_18;
          }
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator++(&local_54);
        }
        std::
        vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ::~vector((vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                   *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0.value_));
      }
      PointCloudEncoder::set_num_encoded_points(&in_RDI->super_PointCloudEncoder,local_18);
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  size_t num_points =
      corner_table->num_vertices() - corner_table->NumIsolatedVertices();

  if (mesh()->num_attributes() > 1) {
    // Gather all corner tables for all non-position attributes.
    std::vector<const MeshAttributeCornerTable *> attribute_corner_tables;
    for (int i = 0; i < mesh()->num_attributes(); ++i) {
      if (mesh()->attribute(i)->attribute_type() ==
          GeometryAttribute::POSITION) {
        continue;
      }
      const MeshAttributeCornerTable *const att_corner_table =
          GetAttributeCornerTable(i);
      // Attribute corner table may not be used in some configurations. For
      // these cases we can assume the attribute connectivity to be the same as
      // the connectivity of the position data.
      if (att_corner_table) {
        attribute_corner_tables.push_back(att_corner_table);
      }
    }

    // Add a new point based on the configuration of interior attribute seams
    // (replicating what the decoder would do).
    for (VertexIndex vi(0); vi < corner_table->num_vertices(); ++vi) {
      if (corner_table->IsVertexIsolated(vi)) {
        continue;
      }
      // Go around all corners of the vertex and keep track of the observed
      // attribute seams.
      const CornerIndex first_corner_index = corner_table->LeftMostCorner(vi);
      const PointIndex first_point_index =
          mesh()->CornerToPointId(first_corner_index);

      PointIndex last_point_index = first_point_index;
      CornerIndex last_corner_index = first_corner_index;
      CornerIndex corner_index = corner_table->SwingRight(first_corner_index);
      size_t num_attribute_seams = 0;
      while (corner_index != kInvalidCornerIndex) {
        const PointIndex point_index = mesh()->CornerToPointId(corner_index);
        bool seam_found = false;
        if (point_index != last_point_index) {
          // Point index changed - new attribute seam detected.
          seam_found = true;
          last_point_index = point_index;
        } else {
          // Even though point indices matches, there still may be a seam caused
          // by non-manifold connectivity of non-position attribute data.
          for (int i = 0; i < attribute_corner_tables.size(); ++i) {
            if (attribute_corner_tables[i]->Vertex(corner_index) !=
                attribute_corner_tables[i]->Vertex(last_corner_index)) {
              seam_found = true;
              break;  // No need to process other attributes.
            }
          }
        }
        if (seam_found) {
          ++num_attribute_seams;
        }

        if (corner_index == first_corner_index) {
          break;
        }

        // Proceed to the next corner
        last_corner_index = corner_index;
        corner_index = corner_table->SwingRight(corner_index);
      }

      if (!corner_table->IsOnBoundary(vi) && num_attribute_seams > 0) {
        // If the last visited point index is the same as the first point index
        // we traveled all the way around the vertex. In this case the number of
        // new points should be num_attribute_seams - 1
        num_points += num_attribute_seams - 1;
      } else {
        // Else the vertex was either on a boundary (i.e. we couldn't travel all
        // around the vertex), or we ended up at a different point. In both of
        // these cases, the number of new points is equal to the number of
        // attribute seams.
        num_points += num_attribute_seams;
      }
    }
  }
  set_num_encoded_points(num_points);
}